

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O2

QPoint QMdi::MinOverlapPlacer::findBestPlacement
                 (QRect *domain,QList<QRect> *rects,QList<QRect> *source)

{
  QPoint QVar1;
  long in_FS_OFFSET;
  QRect QVar2;
  QArrayDataPointer<QRect> local_68;
  QArrayDataPointer<QRect> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = (QRect *)&DAT_aaaaaaaaaaaaaaaa;
  findNonInsiders((QList<QRect> *)&local_48,domain,source);
  if ((source->d).size == 0) {
    local_68.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_68.ptr = (QRect *)&DAT_aaaaaaaaaaaaaaaa;
    findMaxOverlappers((QList<QRect> *)&local_68,domain,(QList<QRect> *)&local_48);
    QVar2 = findMinOverlapRect((QList<QRect> *)&local_68,rects);
    QVar1 = QVar2._0_8_;
    QArrayDataPointer<QRect>::~QArrayDataPointer(&local_68);
  }
  else {
    QVar2 = findMinOverlapRect(source,rects);
    QVar1 = QVar2._0_8_;
  }
  QArrayDataPointer<QRect>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return QVar1;
  }
  __stack_chk_fail();
}

Assistant:

QPoint MinOverlapPlacer::findBestPlacement(const QRect &domain, const QList<QRect> &rects,
                                           QList<QRect> &source)
{
    const QList<QRect> nonInsiders = findNonInsiders(domain, source);

    if (!source.empty())
        return findMinOverlapRect(source, rects).topLeft();

    QList<QRect> maxOverlappers = findMaxOverlappers(domain, nonInsiders);
    return findMinOverlapRect(maxOverlappers, rects).topLeft();
}